

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VScaleAddMulti_Serial(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (nvec < 1) {
    return -1;
  }
  if (nvec == 1) {
    N_VLinearSum_Serial(*a,x,1.0,*Y,*Z);
  }
  else {
    lVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 0x10);
    if (Y == Z) {
      uVar5 = 0;
      do {
        if (0 < lVar1) {
          lVar3 = *(long *)((long)Y[uVar5]->content + 0x10);
          lVar6 = 0;
          do {
            *(double *)(lVar3 + lVar6 * 8) =
                 a[uVar5] * *(double *)(lVar2 + lVar6 * 8) + *(double *)(lVar3 + lVar6 * 8);
            lVar6 = lVar6 + 1;
          } while (lVar1 != lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)nvec);
    }
    else {
      uVar5 = 0;
      do {
        if (0 < lVar1) {
          lVar3 = *(long *)((long)Y[uVar5]->content + 0x10);
          lVar6 = *(long *)((long)Z[uVar5]->content + 0x10);
          lVar4 = 0;
          do {
            *(double *)(lVar6 + lVar4 * 8) =
                 a[uVar5] * *(double *)(lVar2 + lVar4 * 8) + *(double *)(lVar3 + lVar4 * 8);
            lVar4 = lVar4 + 1;
          } while (lVar1 != lVar4);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)nvec);
    }
  }
  return 0;
}

Assistant:

int N_VScaleAddMulti_Serial(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VLinearSum */
  if (nvec == 1) {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      yd = NV_DATA_S(Y[i]);
      for (j=0; j<N; j++) {
        yd[j] += a[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = a[i] * xd[j] + yd[j];
    }
  }
  return(0);
}